

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O2

TextureFormat vkt::pipeline::anon_unknown_0::getSwizzleTargetFormat(TextureFormat format)

{
  TextureChannelClass TVar1;
  TextureFormat TVar2;
  
  TVar1 = tcu::getTextureChannelClass(format.type);
  TVar2.order = RGBA;
  TVar2.type = SIGNED_INT32;
  if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    TVar2 = (TextureFormat)
            ((ulong)(TVar1 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008);
  }
  return TVar2;
}

Assistant:

tcu::TextureFormat getSwizzleTargetFormat (tcu::TextureFormat format)
{
	// Swizzled texture needs to hold all four channels
	// \todo [2016-09-21 pyry] We could save some memory by using smaller formats
	//						   when possible (for example U8).

	const tcu::TextureChannelClass	chnClass	= tcu::getTextureChannelClass(format.type);

	if (chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32);
	else if (chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);
	else
		return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
}